

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_Disasm.c
# Opt level: O2

size_t printDecoratedArg(OPTYPE *pMyOperand,PDISASM pMyDisasm,size_t i)

{
  char *__s;
  int iVar1;
  UInt32 UVar2;
  size_t sVar3;
  long lVar4;
  char (*pacVar5) [16];
  
  __s = pMyDisasm->CompleteInstr;
  (pMyDisasm->CompleteInstr + i)[0] = ' ';
  (pMyDisasm->CompleteInstr + i)[1] = '\0';
  sVar3 = strlen(__s);
  iVar1 = (pMyDisasm->Reserved_).SYNTAX_;
  lVar4 = (long)(pMyDisasm->Reserved_).MemDecoration + -1;
  if (iVar1 == 0) {
    pacVar5 = MasmPrefixes;
LAB_00136b39:
    pacVar5 = pacVar5 + lVar4;
LAB_00136b49:
    strcpy(pMyDisasm->CompleteInstr + sVar3,*pacVar5);
    sVar3 = strlen(__s);
    if ((((pMyDisasm->Reserved_).SEGMENTREGS == 0) && ((pMyDisasm->Reserved_).SEGMENTFS == 0)) &&
       ((pMyDisasm->Prefix).GSPrefix != '\x01')) goto LAB_00136bda;
    UVar2 = find_exp(pMyOperand->SegmentReg);
    strcpy(__s + sVar3,SegmentRegs[UVar2]);
    sVar3 = strlen(__s);
    (__s + sVar3)[0] = '[';
    (__s + sVar3)[1] = '\0';
  }
  else {
    if (iVar1 == 0x800) {
      pacVar5 = IntrinsicPrefixes;
      goto LAB_00136b39;
    }
    if (iVar1 != 0x200) {
      pacVar5 = (char (*) [16])(GoAsmPrefixes + lVar4);
      goto LAB_00136b49;
    }
    strcpy(pMyDisasm->CompleteInstr + sVar3,NasmPrefixes[lVar4]);
    sVar3 = strlen(__s);
    if ((((pMyDisasm->Reserved_).SEGMENTREGS != 0) || ((pMyDisasm->Reserved_).SEGMENTFS != 0)) ||
       ((pMyDisasm->Prefix).GSPrefix == '\x01')) {
      (__s + sVar3)[0] = '[';
      (__s + sVar3)[1] = '\0';
      UVar2 = find_exp(pMyOperand->SegmentReg);
      strcpy(__s + sVar3 + 1,SegmentRegs[UVar2]);
      sVar3 = strlen(__s);
      goto LAB_00136baf;
    }
LAB_00136bda:
    (__s + sVar3)[0] = '[';
    (__s + sVar3)[1] = '\0';
  }
  sVar3 = sVar3 + 1;
LAB_00136baf:
  strcpy(__s + sVar3,pMyOperand->OpMnemonic);
  sVar3 = strlen(__s);
  (__s + sVar3)[0] = ']';
  (__s + sVar3)[1] = '\0';
  return sVar3 + 1;
}

Assistant:

size_t __bea_callspec__ printDecoratedArg(OPTYPE* pMyOperand, PDISASM pMyDisasm, size_t i)
{
  i = printOneSpace(pMyDisasm, i);
  if (GV.SYNTAX_ == NasmSyntax) {
    (void) strcpy ((char*) &pMyDisasm->CompleteInstr+i, NasmPrefixes[GV.MemDecoration-1]);
    i = strlen((char*) &pMyDisasm->CompleteInstr);
    if ((GV.SEGMENTREGS != 0) || (GV.SEGMENTFS != 0) || (pMyDisasm->Prefix.GSPrefix == InUsePrefix)){
      (void) strcpy ((char*) &pMyDisasm->CompleteInstr+i, "[");
      i++;
      (void) strcpy ((char*) &pMyDisasm->CompleteInstr+i, SegmentRegs[find_exp(pMyOperand->SegmentReg)]);
      i = strlen((char*) &pMyDisasm->CompleteInstr);
    }
    else {
      (void) strcpy ((char*) &pMyDisasm->CompleteInstr+i, "[");
      i++;
    }
  }
  else {
    if (GV.SYNTAX_ == MasmSyntax) {
      (void) strcpy ((char*) &pMyDisasm->CompleteInstr+i, MasmPrefixes[GV.MemDecoration-1]);
      i = strlen((char*) &pMyDisasm->CompleteInstr);
    }
    else if (GV.SYNTAX_ == IntrinsicMemSyntax) {
      (void) strcpy ((char*) &pMyDisasm->CompleteInstr+i, IntrinsicPrefixes[GV.MemDecoration-1]);
      i = strlen((char*) &pMyDisasm->CompleteInstr);
    }
    else {
        (void) strcpy ((char*) &pMyDisasm->CompleteInstr+i, GoAsmPrefixes[GV.MemDecoration-1]);
        i = strlen((char*) &pMyDisasm->CompleteInstr);
    }
    if ((GV.SEGMENTREGS != 0) || (GV.SEGMENTFS != 0) || (pMyDisasm->Prefix.GSPrefix == InUsePrefix)){
      (void) strcpy ((char*) &pMyDisasm->CompleteInstr+i, SegmentRegs[find_exp(pMyOperand->SegmentReg)]);
      i = strlen((char*) &pMyDisasm->CompleteInstr);
      (void) strcpy ((char*) &pMyDisasm->CompleteInstr+i, "[");
      i++;
    }
    else {
      (void) strcpy ((char*) &pMyDisasm->CompleteInstr+i, "[");
      i++;
    }
  }
  (void) strcpy ((char*) &pMyDisasm->CompleteInstr+i, (char*) &pMyOperand->OpMnemonic);
  i = strlen((char*) &pMyDisasm->CompleteInstr);
  (void) strcpy ((char*) &pMyDisasm->CompleteInstr+i, "]");
  i++;
  return i;
}